

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O0

void __thiscall LexerTabs::Run(LexerTabs *this)

{
  Test *this_00;
  bool condition;
  string local_68;
  Token local_44;
  undefined1 local_40 [4];
  Token token;
  Lexer lexer;
  LexerTabs *this_local;
  
  lexer.last_token_ = (char *)this;
  Lexer::Lexer((Lexer *)local_40,"   \tfoobar");
  local_44 = Lexer::ReadToken((Lexer *)local_40);
  testing::Test::Check
            (g_current_test,local_44 == INDENT,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
             ,0x5e,"Lexer::INDENT == token");
  local_44 = Lexer::ReadToken((Lexer *)local_40);
  testing::Test::Check
            (g_current_test,local_44 == ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
             ,0x60,"Lexer::ERROR == token");
  this_00 = g_current_test;
  Lexer::DescribeLastError_abi_cxx11_(&local_68,(Lexer *)local_40);
  condition = std::operator==("tabs are not allowed, use spaces",&local_68);
  testing::Test::Check
            (this_00,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/lexer_test.cc"
             ,0x61,"\"tabs are not allowed, use spaces\" == lexer.DescribeLastError()");
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

TEST(Lexer, Tabs) {
  // Verify we print a useful error on a disallowed character.
  Lexer lexer("   \tfoobar");
  Lexer::Token token = lexer.ReadToken();
  EXPECT_EQ(Lexer::INDENT, token);
  token = lexer.ReadToken();
  EXPECT_EQ(Lexer::ERROR, token);
  EXPECT_EQ("tabs are not allowed, use spaces", lexer.DescribeLastError());
}